

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::AssertSnapEquiv_SnapPromiseInfo
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  
  if ((sobj1->SnapObjectTag == SnapPromiseObject) && (sobj2->SnapObjectTag == SnapPromiseObject)) {
    pvVar1 = sobj1->AddtlSnapObjectInfo;
    pvVar2 = sobj2->AddtlSnapObjectInfo;
    NSSnapValues::AssertSnapEquivTTDVar_Special
              (*(TTDVar *)((long)pvVar1 + 8),*(TTDVar *)((long)pvVar2 + 8),compareMap,L"result");
    TTDCompareMap::DiagnosticAssert
              (compareMap,*(int *)((long)pvVar1 + 0x10) == *(int *)((long)pvVar2 + 0x10));
    if (*(int *)((long)pvVar1 + 0x10) != 0) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        NSSnapValues::AssertSnapEquiv
                  ((SnapPromiseReactionInfo *)(*(long *)((long)pvVar1 + 0x18) + lVar3),
                   (SnapPromiseReactionInfo *)(*(long *)((long)pvVar2 + 0x18) + lVar3),compareMap);
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x30;
      } while (uVar4 < *(uint *)((long)pvVar1 + 0x10));
    }
    TTDCompareMap::DiagnosticAssert
              (compareMap,*(int *)((long)pvVar1 + 0x20) == *(int *)((long)pvVar2 + 0x20));
    if (*(int *)((long)pvVar1 + 0x20) != 0) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        NSSnapValues::AssertSnapEquiv
                  ((SnapPromiseReactionInfo *)(*(long *)((long)pvVar1 + 0x28) + lVar3),
                   (SnapPromiseReactionInfo *)(*(long *)((long)pvVar2 + 0x28) + lVar3),compareMap);
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x30;
      } while (uVar4 < *(uint *)((long)pvVar1 + 0x20));
    }
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void AssertSnapEquiv_SnapPromiseInfo(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            const SnapPromiseInfo* promiseInfo1 = SnapObjectGetAddtlInfoAs<SnapPromiseInfo*, SnapObjectType::SnapPromiseObject>(sobj1);
            const SnapPromiseInfo* promiseInfo2 = SnapObjectGetAddtlInfoAs<SnapPromiseInfo*, SnapObjectType::SnapPromiseObject>(sobj2);

            NSSnapValues::AssertSnapEquivTTDVar_Special(promiseInfo1->Result, promiseInfo2->Result, compareMap, _u("result"));

            compareMap.DiagnosticAssert(promiseInfo1->ResolveReactionCount == promiseInfo2->ResolveReactionCount);
            for(uint32 i = 0; i < promiseInfo1->ResolveReactionCount; ++i)
            {
                NSSnapValues::AssertSnapEquiv(promiseInfo1->ResolveReactions + i, promiseInfo2->ResolveReactions + i, compareMap);
            }

            compareMap.DiagnosticAssert(promiseInfo1->RejectReactionCount == promiseInfo2->RejectReactionCount);
            for(uint32 i = 0; i < promiseInfo1->RejectReactionCount; ++i)
            {
                NSSnapValues::AssertSnapEquiv(promiseInfo1->RejectReactions + i, promiseInfo2->RejectReactions + i, compareMap);
            }
        }